

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsPointerToString(WCHAR *stringValue,size_t stringLength,JsValueRef *string)

{
  ScriptContext *scriptContext;
  bool bVar1;
  JsrtContext *pJVar2;
  JavascriptString *pJVar3;
  JsErrorCode JVar4;
  AutoNestedHandledExceptionType local_68 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_48 [8];
  TTDRecorder _actionEntryPopper;
  
  auStack_48 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar2 = JsrtContext::GetCurrent();
  if (pJVar2 == (JsrtContext *)0x0) {
    JVar4 = JsErrorNoCurrentContext;
  }
  else {
    scriptContext =
         (((pJVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_68,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if (scriptContext->TTDShouldPerformRecordAction == true) {
      TTD::EventLog::RecordJsRTCreateString
                (scriptContext->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_48,
                 stringValue,stringLength);
    }
    JVar4 = JsErrorNullArgument;
    if (string != (JsValueRef *)0x0 && stringValue != (WCHAR *)0x0) {
      bVar1 = Js::IsValidCharCount(stringLength);
      if (!bVar1) {
        Js::JavascriptError::ThrowOutOfMemoryError(scriptContext);
      }
      pJVar3 = Js::JavascriptString::NewCopyBuffer
                         (stringValue,(charcount_t)stringLength,scriptContext);
      *string = pJVar3;
      JVar4 = JsNoError;
      if (scriptContext->TTDShouldPerformRecordAction == true) {
        if (_actionEntryPopper.m_actionEvent == (EventLogEntry *)0x0) {
          TTDAbort_unrecoverable_error("Why are we calling this then???");
        }
        *(JavascriptString **)_actionEntryPopper.m_actionEvent = pJVar3;
        JVar4 = JsNoError;
      }
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_68);
    if (auStack_48 != (undefined1  [8])0x0) {
      if (*(int32 *)((long)auStack_48 + 4) != -1) {
        TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
      }
      *(JsErrorCode *)((long)auStack_48 + 4) = JVar4;
    }
  }
  return JVar4;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsPointerToString(_In_reads_(stringLength) const WCHAR *stringValue, _In_ size_t stringLength, _Out_ JsValueRef *string)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTCreateString, stringValue, stringLength);

        PARAM_NOT_NULL(stringValue);
        PARAM_NOT_NULL(string);

        if (!Js::IsValidCharCount(stringLength))
        {
            Js::JavascriptError::ThrowOutOfMemoryError(scriptContext);
        }

        *string = Js::JavascriptString::NewCopyBuffer(stringValue, static_cast<charcount_t>(stringLength), scriptContext);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, string);

        return JsNoError;
    });
}